

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O2

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::GradX<Fad<double>>
          (TPZGeoBlend<pzgeom::TPZGeoTriangle> *this,TPZFMatrix<double> *coord,
          TPZVec<Fad<double>_> *xiInterior,TPZFMatrix<Fad<double>_> *gradx)

{
  int64_t iVar1;
  bool bVar2;
  MElementType elType;
  uint uVar3;
  uint uVar4;
  int iVar5;
  double *pdVar6;
  Fad<double> *pFVar7;
  Fad<double> *pFVar8;
  int i;
  TPZGeoBlend<pzgeom::TPZGeoTriangle> *pTVar9;
  int x;
  long lVar10;
  _func_int **pp_Var11;
  int xi;
  long lVar12;
  TPZFMatrix<Fad<double>_> *pTVar13;
  ulong uVar14;
  int iNode;
  long lVar15;
  int j;
  ulong uVar16;
  TPZFMatrix<Fad<double>_> *this_00;
  int side;
  int subSide;
  double local_2dd8;
  long local_2dd0;
  TPZGeoBlend<pzgeom::TPZGeoTriangle> *local_2dc8;
  TPZVec<Fad<double>_> *local_2dc0;
  TPZFMatrix<Fad<double>_> *local_2db8;
  TPZGeoMesh *local_2db0;
  TPZFMatrix<Fad<double>_> *local_2da8;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> local_2da0;
  ulong local_2d90;
  TPZFMatrix<double> *local_2d88;
  undefined1 local_2d80 [16];
  double *local_2d70;
  double dStack_2d68;
  TPZFMatrix<Fad<double>_> *local_2d60;
  TPZGeoElSideIndex *local_2d58;
  Fad<double> blendFactorSide;
  TPZGeoElSide gelside;
  TPZVec<TPZFMatrix<Fad<double>_>_> gradLinSideVec;
  TPZVec<TPZFMatrix<Fad<double>_>_> gradNonLinSideVec;
  TPZManVector<double,_3> nodeCoord;
  TPZStack<int,_10> allContainedSides;
  TPZFNMatrix<9,_Fad<double>_> dNeighXiDXi_1;
  TPZFNMatrix<3,_Fad<double>_> dCorrFactorSideDxi;
  TPZStack<int,_10> containedNodesInSide;
  TPZFNMatrix<3,_Fad<double>_> dCorrFactorSideDxiProjMat;
  TPZManVector<Fad<double>,_3> neighXi_1;
  TPZManVector<Fad<double>,_3> dCorrFactorSideDxiProj;
  TPZManVector<Fad<double>,_3> Xside;
  TPZManVector<Fad<double>,_3> sideXi;
  TPZManVector<Fad<double>,_3> xiProjectedOverSide;
  TPZFNMatrix<9,_Fad<double>_> gradNeigh_1;
  TPZFNMatrix<9,_Fad<double>_> transfXiToSideXi;
  TPZFNMatrix<27,_Fad<double>_> dCorrFactorDxi;
  TPZFNMatrix<9,_Fad<double>_> gradLinSideXiSide;
  TPZFNMatrix<27,_Fad<double>_> linearSideMappings;
  TPZFNMatrix<9,_Fad<double>_> dXiProjectedOverSideDxi;
  TPZFNMatrix<9,_Fad<double>_> sidePhiVec;
  TPZFNMatrix<27,_Fad<double>_> nonLinearSideMappings;
  TPZFNMatrix<9,_Fad<double>_> dXprojDxiSide;
  TPZFNMatrix<9,_Fad<double>_> dSidePhiDSideXiVec;
  TPZFNMatrix<9,_Fad<double>_> dPhiDxi;
  TPZManVector<Fad<double>,_20> blendFactor;
  TPZFNMatrix<9,_Fad<double>_> phi;
  TPZFNMatrix<45,_Fad<double>_> gradXLin;
  
  local_2db0 = this->fGeoEl->fMesh;
  local_2dc0 = xiInterior;
  local_2db8 = gradx;
  (*(gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xe])(gradx,3,2);
  if (this->fNeighbours[3].fGeoElIndex == -1) {
    local_2dc8 = this;
    TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(&phi,3,1);
    TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(&dPhiDxi,2,3);
    pztopology::TPZTriangle::TShape<Fad<double>>
              (local_2dc0,&phi.super_TPZFMatrix<Fad<double>_>,
               &dPhiDxi.super_TPZFMatrix<Fad<double>_>);
    dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    fRow = (ulong)dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
                  super_TPZBaseMatrix.fRow._4_4_ << 0x20;
    dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    fCol = 0;
    dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    fDecomposed = '\0';
    dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    fDefPositive = '\0';
    dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    _26_6_ = 0;
    local_2d88 = coord;
    TPZFNMatrix<45,_Fad<double>_>::TPZFNMatrix(&gradXLin,3,2,(Fad<double> *)&dCorrFactorDxi);
    local_2d58 = local_2dc8->fNeighbours;
    Fad<double>::~Fad((Fad<double> *)&dCorrFactorDxi);
    for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
          pdVar6 = TPZFMatrix<double>::operator()(local_2d88,lVar10,lVar15);
          local_2dd8 = *pdVar6;
          dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix._24_8_ =
               TPZFMatrix<Fad<double>_>::operator()
                         (&dPhiDxi.super_TPZFMatrix<Fad<double>_>,lVar12,lVar15);
          dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix.fRow = (int64_t)local_2dd8;
          dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix.fCol = 0;
          pFVar7 = TPZFMatrix<Fad<double>_>::operator()
                             (&gradXLin.super_TPZFMatrix<Fad<double>_>,lVar10,lVar12);
          Fad<double>::operator+=
                    (pFVar7,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&dCorrFactorDxi)
          ;
        }
      }
    }
    for (lVar15 = 0; lVar15 < (local_2db8->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
        lVar15 = lVar15 + 1) {
      for (lVar10 = 0; lVar10 < (local_2db8->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol
          ; lVar10 = lVar10 + 1) {
        pFVar7 = TPZFMatrix<Fad<double>_>::operator()
                           (&gradXLin.super_TPZFMatrix<Fad<double>_>,lVar15,lVar10);
        pFVar8 = TPZFMatrix<Fad<double>_>::operator()(local_2db8,lVar15,lVar10);
        Fad<double>::operator=(pFVar8,pFVar7);
      }
    }
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fRow._0_4_ = 0;
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fCol = 0;
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDecomposed = '\0';
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDefPositive = '\0';
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix._26_6_ = 0;
    TPZFNMatrix<27,_Fad<double>_>::TPZFNMatrix
              (&dCorrFactorDxi,3,2,(Fad<double> *)&linearSideMappings);
    TPZVec<TPZFMatrix<Fad<double>_>_>::TPZVec
              (&gradNonLinSideVec,4,&dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>);
    TPZFNMatrix<27,_Fad<double>_>::~TPZFNMatrix(&dCorrFactorDxi);
    Fad<double>::~Fad((Fad<double> *)&linearSideMappings);
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fRow._0_4_ = 0;
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fCol = 0;
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDecomposed = '\0';
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDefPositive = '\0';
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix._26_6_ = 0;
    TPZFNMatrix<27,_Fad<double>_>::TPZFNMatrix
              (&dCorrFactorDxi,3,2,(Fad<double> *)&linearSideMappings);
    TPZVec<TPZFMatrix<Fad<double>_>_>::TPZVec
              (&gradLinSideVec,4,&dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>);
    TPZFNMatrix<27,_Fad<double>_>::~TPZFNMatrix(&dCorrFactorDxi);
    Fad<double>::~Fad((Fad<double> *)&linearSideMappings);
    dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    fRow = dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
           super_TPZBaseMatrix.fRow & 0xffffffff00000000;
    dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    fCol = 0;
    dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    fDecomposed = '\0';
    dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    fDefPositive = '\0';
    dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    _26_6_ = 0;
    TPZManVector<Fad<double>,_20>::TPZManVector(&blendFactor,4,(Fad<double> *)&dCorrFactorDxi);
    Fad<double>::~Fad((Fad<double> *)&dCorrFactorDxi);
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fRow._0_4_ = 0;
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fCol = 0;
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDecomposed = '\0';
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDefPositive = '\0';
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix._26_6_ = 0;
    TPZFNMatrix<27,_Fad<double>_>::TPZFNMatrix
              (&dCorrFactorDxi,4,2,(Fad<double> *)&linearSideMappings);
    pTVar9 = local_2dc8;
    Fad<double>::~Fad((Fad<double> *)&linearSideMappings);
    nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fRow._0_4_ = 0;
    nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fCol = 0;
    nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDecomposed = '\0';
    nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDefPositive = '\0';
    nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix._26_6_ = 0;
    TPZFNMatrix<27,_Fad<double>_>::TPZFNMatrix
              (&linearSideMappings,4,3,(Fad<double> *)&nonLinearSideMappings);
    Fad<double>::~Fad((Fad<double> *)&nonLinearSideMappings);
    transfXiToSideXi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    transfXiToSideXi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fRow._0_4_ = 0;
    transfXiToSideXi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fCol = 0;
    transfXiToSideXi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDecomposed = '\0';
    transfXiToSideXi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDefPositive = '\0';
    transfXiToSideXi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix._26_6_ = 0;
    TPZFNMatrix<27,_Fad<double>_>::TPZFNMatrix
              (&nonLinearSideMappings,4,3,(Fad<double> *)&transfXiToSideXi);
    Fad<double>::~Fad((Fad<double> *)&transfXiToSideXi);
    for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
      transfXiToSideXi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
      super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
      transfXiToSideXi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
      super_TPZBaseMatrix.fRow._0_4_ = 0;
      transfXiToSideXi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
      super_TPZBaseMatrix.fCol = 0;
      transfXiToSideXi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
      super_TPZBaseMatrix.fDecomposed = '\0';
      transfXiToSideXi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
      super_TPZBaseMatrix.fDefPositive = '\0';
      transfXiToSideXi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
      super_TPZBaseMatrix._26_6_ = 0;
      local_2dd0 = lVar15;
      TPZManVector<Fad<double>,_3>::TPZManVector
                (&xiProjectedOverSide,2,(Fad<double> *)&transfXiToSideXi);
      Fad<double>::~Fad((Fad<double> *)&transfXiToSideXi);
      pTVar13 = gradNonLinSideVec.fStore + local_2dd0;
      local_2d60 = gradLinSideVec.fStore + local_2dd0;
      (*gradLinSideVec.fStore[local_2dd0].super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
        super_TPZSavable._vptr_TPZSavable[0xe])(local_2d60,3,2);
      (*(pTVar13->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0xe])(pTVar13,3,2);
      lVar15 = local_2dd0;
      side = (int)local_2dd0 + 3;
      local_2da8 = pTVar13;
      TPZGeoElSide::TPZGeoElSide(&gelside,local_2d58 + local_2dd0,local_2db0);
      bVar2 = IsLinearMapping(pTVar9,side);
      if (((bVar2) || (gelside.fGeoEl == (TPZGeoEl *)0x0)) || (gelside.fSide < 0)) {
        transfXiToSideXi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
        super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             transfXiToSideXi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
             super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable & 0xffffffff00000000;
        Fad<double>::operator=<int,_nullptr>
                  (blendFactor.super_TPZVec<Fad<double>_>.fStore + lVar15,(int *)&transfXiToSideXi);
      }
      else {
        TPZManVector<Fad<double>,_3>::TPZManVector(&sideXi,0);
        TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(&transfXiToSideXi);
        bVar2 = pztopology::TPZTriangle::CheckProjectionForSingularity<Fad<double>>
                          (&side,local_2dc0);
        if (bVar2) {
          pztopology::TPZTriangle::MapToSide<Fad<double>>
                    (side,local_2dc0,&sideXi.super_TPZVec<Fad<double>_>,
                     &transfXiToSideXi.super_TPZFMatrix<Fad<double>_>);
          elType = pztopology::TPZTriangle::Type(side);
          uVar3 = MElementType_NNodes(elType);
          uVar4 = pztopology::TPZTriangle::SideDimension(side);
          TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(&sidePhiVec,(long)(int)uVar3,1);
          lVar15 = (long)(int)uVar4;
          TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(&dSidePhiDSideXiVec,lVar15,(long)(int)uVar3);
          GetSideShapeFunction<pzgeom::TPZGeoTriangle>
                    (side,&sideXi.super_TPZVec<Fad<double>_>,
                     &sidePhiVec.super_TPZFMatrix<Fad<double>_>,
                     &dSidePhiDSideXiVec.super_TPZFMatrix<Fad<double>_>);
          dXiProjectedOverSideDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
          dXiProjectedOverSideDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix.fRow._0_4_ = 0;
          dXiProjectedOverSideDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix.fCol = 0;
          dXiProjectedOverSideDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix.fDecomposed = '\0';
          dXiProjectedOverSideDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix.fDefPositive = '\0';
          dXiProjectedOverSideDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix._26_6_ = 0;
          TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
                    (&dXprojDxiSide,2,lVar15,(Fad<double> *)&dXiProjectedOverSideDxi);
          Fad<double>::~Fad((Fad<double> *)&dXiProjectedOverSideDxi);
          gradLinSideXiSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
          gradLinSideXiSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix.fRow._0_4_ = 0;
          gradLinSideXiSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix.fCol = 0;
          gradLinSideXiSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix.fDecomposed = '\0';
          gradLinSideXiSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix.fDefPositive = '\0';
          gradLinSideXiSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix._26_6_ = 0;
          TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
                    (&dXiProjectedOverSideDxi,2,2,(Fad<double> *)&gradLinSideXiSide);
          Fad<double>::~Fad((Fad<double> *)&gradLinSideXiSide);
          TPZManVector<double,_3>::TPZManVector(&nodeCoord,0);
          dNeighXiDXi_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
          dNeighXiDXi_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix.fRow =
               dNeighXiDXi_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
               super_TPZBaseMatrix.fRow & 0xffffffff00000000;
          dNeighXiDXi_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix.fCol = 0;
          dNeighXiDXi_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix.fDecomposed = '\0';
          dNeighXiDXi_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix.fDefPositive = '\0';
          dNeighXiDXi_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix._26_6_ = 0;
          TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
                    (&gradLinSideXiSide,3,lVar15,(Fad<double> *)&dNeighXiDXi_1);
          Fad<double>::~Fad((Fad<double> *)&dNeighXiDXi_1);
          if ((int)uVar4 < 1) {
            uVar4 = 0;
          }
          if ((int)uVar3 < 1) {
            uVar3 = 0;
          }
          local_2d90 = (ulong)uVar3;
          for (uVar16 = 0; uVar16 != local_2d90; uVar16 = uVar16 + 1) {
            iVar5 = pztopology::TPZTriangle::SideNodeLocId(side,(int)uVar16);
            for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
              pdVar6 = TPZFMatrix<double>::operator()(local_2d88,lVar15,(long)iVar5);
              local_2dd8 = *pdVar6;
              dNeighXiDXi_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
              super_TPZBaseMatrix._24_8_ =
                   TPZFMatrix<Fad<double>_>::operator()
                             (&sidePhiVec.super_TPZFMatrix<Fad<double>_>,uVar16,0);
              dNeighXiDXi_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
              super_TPZBaseMatrix.fRow = (int64_t)local_2dd8;
              dNeighXiDXi_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
              super_TPZBaseMatrix.fCol = 0;
              pFVar7 = TPZFMatrix<Fad<double>_>::operator()
                                 (&linearSideMappings.super_TPZFMatrix<Fad<double>_>,local_2dd0,
                                  lVar15);
              Fad<double>::operator+=
                        (pFVar7,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
                                &dNeighXiDXi_1);
            }
            pztopology::TPZTriangle::ParametricDomainNodeCoord
                      (iVar5,&nodeCoord.super_TPZVec<double>);
            lVar15 = 0;
            for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
              local_2dd8 = nodeCoord.super_TPZVec<double>.fStore[lVar10];
              dNeighXiDXi_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
              super_TPZBaseMatrix._24_8_ =
                   TPZFMatrix<Fad<double>_>::operator()
                             (&sidePhiVec.super_TPZFMatrix<Fad<double>_>,uVar16,0);
              dNeighXiDXi_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
              super_TPZBaseMatrix.fRow = (int64_t)local_2dd8;
              dNeighXiDXi_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
              super_TPZBaseMatrix.fCol = 0;
              Fad<double>::operator+=
                        ((Fad<double> *)
                         ((long)&(xiProjectedOverSide.super_TPZVec<Fad<double>_>.fStore)->val_ +
                         lVar15),(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
                                 &dNeighXiDXi_1);
              lVar15 = lVar15 + 0x20;
            }
            for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
              for (uVar14 = 0; uVar4 != uVar14; uVar14 = uVar14 + 1) {
                pdVar6 = TPZFMatrix<double>::operator()(local_2d88,lVar15,(long)iVar5);
                local_2dd8 = *pdVar6;
                dNeighXiDXi_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
                super_TPZBaseMatrix._24_8_ =
                     TPZFMatrix<Fad<double>_>::operator()
                               (&dSidePhiDSideXiVec.super_TPZFMatrix<Fad<double>_>,uVar14,uVar16);
                dNeighXiDXi_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
                super_TPZBaseMatrix.fRow = (int64_t)local_2dd8;
                dNeighXiDXi_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
                super_TPZBaseMatrix.fCol = 0;
                pFVar7 = TPZFMatrix<Fad<double>_>::operator()
                                   (&gradLinSideXiSide.super_TPZFMatrix<Fad<double>_>,lVar15,uVar14)
                ;
                Fad<double>::operator+=
                          (pFVar7,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
                                  &dNeighXiDXi_1);
              }
            }
            for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
              for (uVar14 = 0; uVar4 != uVar14; uVar14 = uVar14 + 1) {
                local_2dd8 = nodeCoord.super_TPZVec<double>.fStore[lVar15];
                dNeighXiDXi_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
                super_TPZBaseMatrix._24_8_ =
                     TPZFMatrix<Fad<double>_>::operator()
                               (&dSidePhiDSideXiVec.super_TPZFMatrix<Fad<double>_>,uVar14,uVar16);
                dNeighXiDXi_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
                super_TPZBaseMatrix.fRow = (int64_t)local_2dd8;
                dNeighXiDXi_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
                super_TPZBaseMatrix.fCol = 0;
                pFVar7 = TPZFMatrix<Fad<double>_>::operator()
                                   (&dXprojDxiSide.super_TPZFMatrix<Fad<double>_>,lVar15,uVar14);
                Fad<double>::operator+=
                          (pFVar7,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
                                  &dNeighXiDXi_1);
              }
            }
          }
          TPZMatrix<Fad<double>_>::Multiply
                    ((TPZMatrix<Fad<double>_> *)&gradLinSideXiSide,
                     &transfXiToSideXi.super_TPZFMatrix<Fad<double>_>,local_2d60,0);
          TPZMatrix<Fad<double>_>::Multiply
                    ((TPZMatrix<Fad<double>_> *)&dXprojDxiSide,
                     &transfXiToSideXi.super_TPZFMatrix<Fad<double>_>,
                     &dXiProjectedOverSideDxi.super_TPZFMatrix<Fad<double>_>,0);
          gradNeigh_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
          gradNeigh_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix.fRow._0_4_ = 0;
          gradNeigh_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix.fCol = 0;
          gradNeigh_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix.fDecomposed = '\0';
          gradNeigh_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix.fDefPositive = '\0';
          gradNeigh_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix._26_6_ = 0;
          TPZManVector<Fad<double>,_3>::TPZManVector
                    ((TPZManVector<Fad<double>,_3> *)&dNeighXiDXi_1,2,(Fad<double> *)&gradNeigh_1);
          Fad<double>::~Fad((Fad<double> *)&gradNeigh_1);
          local_2dd8 = (double)(local_2dd0 * 0x20);
          pztopology::TPZTriangle::BlendFactorForSide<Fad<double>>
                    (&side,local_2dc0,blendFactor.super_TPZVec<Fad<double>_>.fStore + local_2dd0,
                     (TPZVec<Fad<double>_> *)&dNeighXiDXi_1);
          lVar10 = 0;
          for (lVar15 = 0;
              iVar1 = dNeighXiDXi_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
                      super_TPZBaseMatrix.fRow, lVar15 != 2; lVar15 = lVar15 + 1) {
            pFVar7 = TPZFMatrix<Fad<double>_>::operator()
                               (&dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>,local_2dd0,lVar15);
            Fad<double>::operator=(pFVar7,(Fad<double> *)(iVar1 + lVar10));
            lVar10 = lVar10 + 0x20;
          }
          TPZManVector<Fad<double>,_3>::~TPZManVector
                    ((TPZManVector<Fad<double>,_3> *)&dNeighXiDXi_1);
          iVar5 = TPZGeoElSide::Dimension(&gelside);
          TPZManVector<Fad<double>,_3>::TPZManVector(&neighXi_1,0);
          TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(&dNeighXiDXi_1);
          bVar2 = MapToNeighSide<Fad<double>>
                            (local_2dc8,side,iVar5,local_2dc0,&neighXi_1.super_TPZVec<Fad<double>_>,
                             &dNeighXiDXi_1.super_TPZFMatrix<Fad<double>_>);
          pTVar9 = local_2dc8;
          if (bVar2) {
            gradNeigh_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
            super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
            gradNeigh_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
            super_TPZBaseMatrix.fRow._0_4_ = 0;
            gradNeigh_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
            super_TPZBaseMatrix.fCol = 0;
            gradNeigh_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
            super_TPZBaseMatrix.fDecomposed = '\0';
            gradNeigh_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
            super_TPZBaseMatrix.fDefPositive = '\0';
            gradNeigh_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
            super_TPZBaseMatrix._26_6_ = 0;
            TPZManVector<Fad<double>,_3>::TPZManVector(&Xside,3,(Fad<double> *)&gradNeigh_1);
            Fad<double>::~Fad((Fad<double> *)&gradNeigh_1);
            Neighbour((TPZGeoElSide *)&gradNeigh_1,pTVar9,side,local_2db0);
            TPZGeoElSide::X((TPZGeoElSide *)&gradNeigh_1,&neighXi_1.super_TPZVec<Fad<double>_>,
                            &Xside.super_TPZVec<Fad<double>_>);
            TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(&gradNeigh_1);
            Neighbour((TPZGeoElSide *)&dCorrFactorSideDxi,pTVar9,side,local_2db0);
            TPZGeoElSide::GradX((TPZGeoElSide *)&dCorrFactorSideDxi,
                                &neighXi_1.super_TPZVec<Fad<double>_>,
                                &gradNeigh_1.super_TPZFMatrix<Fad<double>_>);
            lVar10 = 0;
            for (lVar15 = 0; pFVar7 = Xside.super_TPZVec<Fad<double>_>.fStore, lVar15 != 3;
                lVar15 = lVar15 + 1) {
              pFVar8 = TPZFMatrix<Fad<double>_>::operator()
                                 (&nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>,local_2dd0,
                                  lVar15);
              Fad<double>::operator=(pFVar8,(Fad<double> *)((long)&pFVar7->val_ + lVar10));
              lVar10 = lVar10 + 0x20;
            }
            TPZMatrix<Fad<double>_>::Multiply
                      ((TPZMatrix<Fad<double>_> *)&gradNeigh_1,
                       &dNeighXiDXi_1.super_TPZFMatrix<Fad<double>_>,local_2da8,0);
            TPZStack<int,_10>::TPZStack(&containedNodesInSide);
            pTVar9 = local_2dc8;
            pztopology::TPZTriangle::LowerDimensionSides(side,&containedNodesInSide,0);
            TPZStack<int,_10>::TPZStack(&allContainedSides);
            pztopology::TPZTriangle::LowerDimensionSides(side,&allContainedSides);
            uVar16 = (ulong)(int)containedNodesInSide.super_TPZManVector<int,_10>.super_TPZVec<int>.
                                 fNElements;
            while ((long)uVar16 <
                   allContainedSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements) {
              subSide = allContainedSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore
                        [uVar16];
              local_2d90 = uVar16;
              bVar2 = IsLinearMapping(pTVar9,subSide);
              if (!bVar2) {
                blendFactorSide.val_ = -1.0;
                blendFactorSide.dx_.num_elts = 0;
                blendFactorSide.dx_.ptr_to_data = (double *)0x0;
                blendFactorSide.defaultVal = 0.0;
                dCorrFactorSideDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
                super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
                dCorrFactorSideDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
                super_TPZBaseMatrix.fRow =
                     dCorrFactorSideDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>
                     .super_TPZBaseMatrix.fRow & 0xffffffff00000000;
                dCorrFactorSideDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
                super_TPZBaseMatrix.fCol = 0;
                dCorrFactorSideDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
                super_TPZBaseMatrix.fDecomposed = '\0';
                dCorrFactorSideDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
                super_TPZBaseMatrix.fDefPositive = '\0';
                dCorrFactorSideDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
                super_TPZBaseMatrix._26_6_ = 0;
                TPZManVector<Fad<double>,_3>::TPZManVector
                          (&dCorrFactorSideDxiProj,2,(Fad<double> *)&dCorrFactorSideDxi);
                Fad<double>::~Fad((Fad<double> *)&dCorrFactorSideDxi);
                dCorrFactorSideDxiProjMat.super_TPZFMatrix<Fad<double>_>.
                super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
                     = (_func_int **)0x0;
                dCorrFactorSideDxiProjMat.super_TPZFMatrix<Fad<double>_>.
                super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow =
                     dCorrFactorSideDxiProjMat.super_TPZFMatrix<Fad<double>_>.
                     super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow & 0xffffffff00000000;
                dCorrFactorSideDxiProjMat.super_TPZFMatrix<Fad<double>_>.
                super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol = 0;
                dCorrFactorSideDxiProjMat.super_TPZFMatrix<Fad<double>_>.
                super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
                dCorrFactorSideDxiProjMat.super_TPZFMatrix<Fad<double>_>.
                super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
                dCorrFactorSideDxiProjMat.super_TPZFMatrix<Fad<double>_>.
                super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix._26_6_ = 0;
                TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix
                          (&dCorrFactorSideDxi,2,1,(Fad<double> *)&dCorrFactorSideDxiProjMat);
                Fad<double>::~Fad((Fad<double> *)&dCorrFactorSideDxiProjMat);
                pztopology::TPZTriangle::BlendFactorForSide<Fad<double>>
                          (&subSide,&xiProjectedOverSide.super_TPZVec<Fad<double>_>,&blendFactorSide
                           ,&dCorrFactorSideDxiProj.super_TPZVec<Fad<double>_>);
                local_2d80._0_8_ = (Fad<double> *)0x0;
                local_2d80._8_8_ = local_2d80._8_8_ & 0xffffffff00000000;
                local_2d70 = (double *)0x0;
                dStack_2d68 = 0.0;
                TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix
                          (&dCorrFactorSideDxiProjMat,1,2,(Fad<double> *)local_2d80);
                Fad<double>::~Fad((Fad<double> *)local_2d80);
                lVar10 = 0;
                for (lVar15 = 0; pFVar7 = dCorrFactorSideDxiProj.super_TPZVec<Fad<double>_>.fStore,
                    lVar15 != 2; lVar15 = lVar15 + 1) {
                  pFVar8 = TPZFMatrix<Fad<double>_>::operator()
                                     (&dCorrFactorSideDxiProjMat.super_TPZFMatrix<Fad<double>_>,0,
                                      lVar15);
                  Fad<double>::operator=(pFVar8,(Fad<double> *)((long)&pFVar7->val_ + lVar10));
                  lVar10 = lVar10 + 0x20;
                }
                TPZMatrix<Fad<double>_>::Multiply
                          ((TPZMatrix<Fad<double>_> *)&dCorrFactorSideDxiProjMat,
                           &dXiProjectedOverSideDxi.super_TPZFMatrix<Fad<double>_>,
                           &dCorrFactorSideDxi.super_TPZFMatrix<Fad<double>_>,0);
                this_00 = gradNonLinSideVec.fStore + (long)subSide + -3;
                pTVar13 = gradLinSideVec.fStore + (long)subSide + -3;
                for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
                  pFVar7 = TPZFMatrix<Fad<double>_>::operator()
                                     (&nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>,
                                      (long)subSide + -3,lVar15);
                  local_2da0.fadexpr_.right_ =
                       TPZFMatrix<Fad<double>_>::operator()
                                 (&linearSideMappings.super_TPZFMatrix<Fad<double>_>,
                                  (long)subSide + -3,lVar15);
                  local_2d80._0_8_ = &blendFactorSide;
                  local_2d80._8_8_ = &local_2da0;
                  local_2da0.fadexpr_.left_ = pFVar7;
                  pFVar7 = TPZFMatrix<Fad<double>_>::operator()
                                     (&nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>,
                                      local_2dd0,lVar15);
                  Fad<double>::operator-=
                            (pFVar7,(FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                                     *)local_2d80);
                  for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
                    pFVar7 = TPZFMatrix<Fad<double>_>::operator()(this_00,lVar15,lVar10);
                    local_2da0.fadexpr_.right_ =
                         TPZFMatrix<Fad<double>_>::operator()(pTVar13,lVar15,lVar10);
                    local_2d80._0_8_ = &blendFactorSide;
                    local_2d80._8_8_ = &local_2da0;
                    local_2da0.fadexpr_.left_ = pFVar7;
                    pFVar7 = TPZFMatrix<Fad<double>_>::operator()(local_2da8,lVar15,lVar10);
                    Fad<double>::operator-=
                              (pFVar7,(FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                                       *)local_2d80);
                    pFVar7 = TPZFMatrix<Fad<double>_>::operator()
                                       (&dCorrFactorSideDxi.super_TPZFMatrix<Fad<double>_>,0,lVar10)
                    ;
                    pFVar8 = TPZFMatrix<Fad<double>_>::operator()
                                       (&nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>,
                                        (long)subSide + -3,lVar15);
                    local_2da0.fadexpr_.right_ =
                         TPZFMatrix<Fad<double>_>::operator()
                                   (&linearSideMappings.super_TPZFMatrix<Fad<double>_>,
                                    (long)subSide + -3,lVar15);
                    local_2d80._8_8_ = &local_2da0;
                    local_2da0.fadexpr_.left_ = pFVar8;
                    local_2d80._0_8_ = pFVar7;
                    pFVar7 = TPZFMatrix<Fad<double>_>::operator()(local_2da8,lVar15,lVar10);
                    Fad<double>::operator-=
                              (pFVar7,(FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                                       *)local_2d80);
                  }
                }
                TPZFNMatrix<3,_Fad<double>_>::~TPZFNMatrix(&dCorrFactorSideDxiProjMat);
                TPZFNMatrix<3,_Fad<double>_>::~TPZFNMatrix(&dCorrFactorSideDxi);
                TPZManVector<Fad<double>,_3>::~TPZManVector(&dCorrFactorSideDxiProj);
                Fad<double>::~Fad(&blendFactorSide);
                pTVar9 = local_2dc8;
              }
              uVar16 = local_2d90 + 1;
            }
            for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
              for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
                pp_Var11 = (_func_int **)
                           ((long)&(blendFactor.super_TPZVec<Fad<double>_>.fStore)->val_ +
                           (long)local_2dd8);
                pFVar7 = TPZFMatrix<Fad<double>_>::operator()(local_2da8,lVar15,lVar10);
                dCorrFactorSideDxiProjMat.super_TPZFMatrix<Fad<double>_>.
                super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow =
                     (int64_t)TPZFMatrix<Fad<double>_>::operator()(local_2d60,lVar15,lVar10);
                dCorrFactorSideDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
                super_TPZBaseMatrix.fRow = (int64_t)&dCorrFactorSideDxiProjMat;
                dCorrFactorSideDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
                super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = pp_Var11;
                dCorrFactorSideDxiProjMat.super_TPZFMatrix<Fad<double>_>.
                super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
                     = (_func_int **)pFVar7;
                pFVar7 = TPZFMatrix<Fad<double>_>::operator()(local_2db8,lVar15,lVar10);
                Fad<double>::operator+=
                          (pFVar7,(FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                                   *)&dCorrFactorSideDxi);
                lVar12 = local_2dd0;
                pFVar7 = TPZFMatrix<Fad<double>_>::operator()
                                   (&dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>,local_2dd0,lVar10
                                   );
                pFVar8 = TPZFMatrix<Fad<double>_>::operator()
                                   (&nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>,lVar12,
                                    lVar15);
                dCorrFactorSideDxiProjMat.super_TPZFMatrix<Fad<double>_>.
                super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow =
                     (int64_t)TPZFMatrix<Fad<double>_>::operator()
                                        (&linearSideMappings.super_TPZFMatrix<Fad<double>_>,lVar12,
                                         lVar15);
                dCorrFactorSideDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
                super_TPZBaseMatrix.fRow = (int64_t)&dCorrFactorSideDxiProjMat;
                dCorrFactorSideDxi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
                super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)pFVar7;
                dCorrFactorSideDxiProjMat.super_TPZFMatrix<Fad<double>_>.
                super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
                     = (_func_int **)pFVar8;
                pFVar7 = TPZFMatrix<Fad<double>_>::operator()(local_2db8,lVar15,lVar10);
                Fad<double>::operator+=
                          (pFVar7,(FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                                   *)&dCorrFactorSideDxi);
              }
            }
            TPZManVector<int,_10>::~TPZManVector(&allContainedSides.super_TPZManVector<int,_10>);
            TPZManVector<int,_10>::~TPZManVector(&containedNodesInSide.super_TPZManVector<int,_10>);
            TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&gradNeigh_1);
            TPZManVector<Fad<double>,_3>::~TPZManVector(&Xside);
          }
          pTVar9 = local_2dc8;
          TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&dNeighXiDXi_1);
          TPZManVector<Fad<double>,_3>::~TPZManVector(&neighXi_1);
          TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&gradLinSideXiSide);
          TPZManVector<double,_3>::~TPZManVector(&nodeCoord);
          TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&dXiProjectedOverSideDxi);
          TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&dXprojDxiSide);
          TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&dSidePhiDSideXiVec);
          TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&sidePhiVec);
          lVar15 = local_2dd0;
        }
        TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&transfXiToSideXi);
        TPZManVector<Fad<double>,_3>::~TPZManVector(&sideXi);
      }
      TPZManVector<Fad<double>,_3>::~TPZManVector(&xiProjectedOverSide);
    }
    TPZFNMatrix<27,_Fad<double>_>::~TPZFNMatrix(&nonLinearSideMappings);
    TPZFNMatrix<27,_Fad<double>_>::~TPZFNMatrix(&linearSideMappings);
    TPZFNMatrix<27,_Fad<double>_>::~TPZFNMatrix(&dCorrFactorDxi);
    TPZManVector<Fad<double>,_20>::~TPZManVector(&blendFactor);
    TPZVec<TPZFMatrix<Fad<double>_>_>::~TPZVec(&gradLinSideVec);
    TPZVec<TPZFMatrix<Fad<double>_>_>::~TPZVec(&gradNonLinSideVec);
    TPZFNMatrix<45,_Fad<double>_>::~TPZFNMatrix(&gradXLin);
    TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&dPhiDxi);
    TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&phi);
  }
  else {
    TPZManVector<Fad<double>,_3>::TPZManVector
              ((TPZManVector<Fad<double>,_3> *)&linearSideMappings,0);
    TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)&gradXLin);
    bVar2 = MapToNeighSide<Fad<double>>
                      (this,6,2,local_2dc0,(TPZVec<Fad<double>_> *)&linearSideMappings,
                       &gradXLin.super_TPZFMatrix<Fad<double>_>);
    if (!bVar2) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
                 ,0x80);
    }
    TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)&dCorrFactorDxi);
    TPZGeoElSide::TPZGeoElSide
              ((TPZGeoElSide *)&nonLinearSideMappings,this->fNeighbours + 3,local_2db0);
    TPZGeoElSide::GradX((TPZGeoElSide *)&nonLinearSideMappings,
                        (TPZVec<Fad<double>_> *)&linearSideMappings,
                        &dCorrFactorDxi.super_TPZFMatrix<Fad<double>_>);
    TPZMatrix<Fad<double>_>::Multiply
              ((TPZMatrix<Fad<double>_> *)&dCorrFactorDxi,&gradXLin.super_TPZFMatrix<Fad<double>_>,
               local_2db8,0);
    TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)&dCorrFactorDxi);
    TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)&gradXLin);
    TPZManVector<Fad<double>,_3>::~TPZManVector((TPZManVector<Fad<double>,_3> *)&linearSideMappings)
    ;
  }
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::GradX(TPZFMatrix<REAL> &coord, TPZVec<T> &xiInterior, TPZFMatrix<T> &gradx) const {

    TPZGeoEl &gel = *fGeoEl;
    TPZGeoMesh *gmesh = gel.Mesh();
#ifdef PZ_LOG
    const auto VAL_WIDTH = 10;
    std::ostringstream soutLogDebug;
    if(logger.isDebugEnabled())
    {   soutLogDebug<<"======================_______REF_1"<<std::endl;
        soutLogDebug << "TPZGeoBlend<" <<MElementType_Name(TGeo::Type())<<">::GradX"<<std::endl;
        soutLogDebug << "element id " <<gel.Id()<<std::endl;
        soutLogDebug << "xi: ";
        for(int i = 0; i < xiInterior.size(); i++) soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<xiInterior[i]<<"\t";
        soutLogDebug<<std::endl;
    }
#endif
    const REAL zero = 1e-14;
    gradx.Redim(3,TGeo::Dimension);

    if (fNeighbours[TGeo::NSides - 1 -TGeo::NNodes].ElementIndex() != -1){
        TPZManVector<T, 3> neighXi;
        TPZFNMatrix<9, T> dNeighXiDXi;
        if (!MapToNeighSide(TGeo::NSides-1, TGeo::Dimension, xiInterior, neighXi, dNeighXiDXi)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << xi << " and side " << TGeo::NSides-1 << ". Aborting...";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            DebugStop();
        }
        TPZFNMatrix<9, T> gradNeigh;
        Neighbour(TGeo::NSides-1, gmesh).GradX(neighXi, gradNeigh);
        gradNeigh.Multiply(dNeighXiDXi,gradx);//gradNonLinSide = gradNeigh.dNeighXiDXi
        return;
    }

    /**
     * The non-linear mapping is calculated from deviations of the linear mapping.
     * The linear mapping of an element (or of any of its side) can be calculated with the barycentric coordinates
     * of the nodes contained in it
     */
    TPZFNMatrix<9, T> phi(TGeo::NNodes, 1), dPhiDxi(TGeo::Dimension, TGeo::NNodes);
    TGeo::TShape(xiInterior, phi, dPhiDxi);//gets the barycentric coordinates


    TPZFNMatrix<45,T> gradXLin(3, TGeo::Dimension,(T)0);
    for (int iNode = 0; iNode < TGeo::NNodes; iNode++) {//calculates the linear mapping
        for(int x = 0; x < 3; x++) {
            for (int xi = 0; xi < TGeo::Dimension; xi++) {
                gradXLin(x, xi) += coord(x, iNode) * dPhiDxi(xi, iNode);
            }
        }
    }
    for(int i = 0; i < gradx.Rows(); i++){
        for(int j = 0; j < gradx.Cols(); j++){
            gradx(i,j) = gradXLin(i,j);
        }
    }

#ifdef PZ_LOG
    soutLogDebug<<"FIRST TERM"<<std::endl;
    soutLogDebug << "gradient of linear mapping:\n";
    if (logger.isDebugEnabled()) {
        for (int i = 0; i < gradXLin.Rows(); i++) {
            for (int j = 0; j < gradXLin.Cols(); j++) {
                soutLogDebug << std::setw(VAL_WIDTH) << std::right << gradXLin(i, j);
                if (j != gradXLin.Cols() - 1) soutLogDebug << "\t";
            }
            soutLogDebug << std::endl;
        }
    }

#endif
    /**
     * Now, the deviation for any non-linearity of the sides' mappings must be taken into account.
     */

    TPZVec<TPZFMatrix<T> > gradNonLinSideVec(TGeo::NSides - TGeo::NNodes,
                                             TPZFNMatrix<27,T>(3, TGeo::Dimension, 0));
    TPZVec<TPZFMatrix<T> > gradLinSideVec(TGeo::NSides - TGeo::NNodes,
                                          TPZFNMatrix<27,T>(3, TGeo::Dimension, 0));
    TPZManVector<T, 20> blendFactor(TGeo::NSides - TGeo::NNodes, (T)0);
    TPZFNMatrix<27,T> dCorrFactorDxi(TGeo::NSides - TGeo::NNodes, TGeo::Dimension, (T) 0);
    TPZFNMatrix<27, T> linearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    TPZFNMatrix<27, T> nonLinearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    for (int sideIndex = 0; sideIndex < TGeo::NSides - TGeo::NNodes - 1; sideIndex++) {
        TPZManVector<T, 3> xiProjectedOverSide(TGeo::Dimension, 0);
        TPZFMatrix<T> &gradNonLinSide = gradNonLinSideVec[sideIndex];
        TPZFMatrix<T> &gradLinSide = gradLinSideVec[sideIndex];
        gradLinSide.Redim(3,TGeo::Dimension);
        gradNonLinSide.Redim(3,TGeo::Dimension);

        int side = TGeo::NNodes + sideIndex;
        TPZGeoElSide gelside(fNeighbours[sideIndex], gmesh);
        #ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "================================" << std::endl;
            soutLogDebug << "side: " << side << " is linear: ";
        }
        #endif
        if (IsLinearMapping(side) || !gelside.Exists()) {
            blendFactor[sideIndex] = 0;
            #ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                if (IsLinearMapping(side)) soutLogDebug << "true" << std::endl;
                else soutLogDebug << "false (no gelside) " << std::endl;
            }
            #endif
            continue;
        }
        #ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "false (gelside exists) " << std::endl;
        }
        #endif
        /**
     * Calculates the linear mapping of the side sideIndex, and the projected point on sideIndex
     */
        TPZManVector<T, 3> sideXi;
        TPZFNMatrix<9, T> transfXiToSideXi;
        bool regularMap = TGeo::CheckProjectionForSingularity(side, xiInterior);
        if (!regularMap) {
            #ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "mapping is not regular. skipping side... ";

            }
            #endif
            continue;
        }

        this->MapToSide(side, xiInterior, sideXi, transfXiToSideXi);
        MElementType sideType = TGeo::Type(side);
        const int nSideNodes = MElementType_NNodes(sideType);
        const int sideDim = TGeo::SideDimension(side);
        TPZFNMatrix<9, T> sidePhiVec(nSideNodes, 1),
                dSidePhiDSideXiVec(sideDim, nSideNodes);
        GetSideShapeFunction<TGeo>(side, sideXi, sidePhiVec, dSidePhiDSideXiVec);

        TPZFNMatrix<9, T> dXprojDxiSide(TGeo::Dimension,sideDim,(T)0),
                dXiProjectedOverSideDxi(TGeo::Dimension,TGeo::Dimension,(T)0);
        TPZManVector<REAL, 3> nodeCoord;
        //calculation of transformation for the derivatives of sidephi
        
        TPZFNMatrix<9, T> gradLinSideXiSide(3,sideDim,(T)0);
        for (int iNode = 0; iNode < nSideNodes; iNode++) {
            const int currentNode = TGeo::SideNodeLocId(side, iNode);

            for (int x = 0; x < 3; x++) {
                linearSideMappings(sideIndex, x) +=
                        coord(x, currentNode) * sidePhiVec(iNode, 0);
            }

            TGeo::ParametricDomainNodeCoord(currentNode, nodeCoord);
            for (int x = 0; x < TGeo::Dimension; x++) {
                xiProjectedOverSide[x] += nodeCoord[x] * sidePhiVec(iNode, 0);
            }

            for(int x = 0; x < 3; x++){
                for(int xi = 0; xi < sideDim; xi++) {
                    gradLinSideXiSide(x,xi) += coord(x, currentNode) * dSidePhiDSideXiVec(xi,iNode);
                }
            }

            for (int i = 0; i < TGeo::Dimension; i++) {
                for (int j = 0; j < sideDim; j++) {
                    dXprojDxiSide(i,j) += nodeCoord[i] * dSidePhiDSideXiVec(j,iNode);
                }
            }

        }

        gradLinSideXiSide.Multiply(transfXiToSideXi,gradLinSide);//gradLinSideTemp = gradLinSideXiSide.transfXiToSideXi
        dXprojDxiSide.Multiply(transfXiToSideXi,dXiProjectedOverSideDxi);//dXprojDxiTemp = dXprojDxiSide.transfXiToSideXi

        #ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "xi projection over side: ";
            for (int x = 0; x < TGeo::Dimension; x++) soutLogDebug << xiProjectedOverSide[x] << "\t";
            soutLogDebug << "\nGrad of projected point to side:\n";
            for(int i = 0; i < dXiProjectedOverSideDxi.Rows(); i++){
                for(int j = 0; j < dXiProjectedOverSideDxi.Cols(); j++){
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<dXiProjectedOverSideDxi(i,j);
                    if(j != dXiProjectedOverSideDxi.Cols() - 1) soutLogDebug<<"\t";
                }
                soutLogDebug<<std::endl;
            }
            soutLogDebug << std::endl << "xi projection in side domain:";
            for (int x = 0; x < sideXi.size(); x++) soutLogDebug << sideXi[x] << "\t";
            soutLogDebug << "\nTransformation from x side to xi interior:\n";
            for(int i = 0; i < transfXiToSideXi.Rows(); i++){
                for(int j = 0; j < transfXiToSideXi.Cols(); j++){
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<transfXiToSideXi(i,j);
                    if(j != transfXiToSideXi.Cols() - 1) soutLogDebug<<"\t";
                }
                soutLogDebug<<std::endl;
            }
            soutLogDebug << std::endl << "\nLinear mapping of projected point: ";
            for (int x = 0; x < 3; x++) soutLogDebug << linearSideMappings(sideIndex, x) << "\t";
            soutLogDebug << "\nGrad of linear mapping of point projected to side:\n";
            for(int i = 0; i < gradLinSide.Rows(); i++){
                for(int j = 0; j < gradLinSide.Cols(); j++){
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<gradLinSide(i,j);
                    if(j != gradLinSide.Cols() - 1) soutLogDebug<<"\t";
                }
                soutLogDebug<<std::endl;
            }
        }
        #endif
        /**
         * Calculates the non-linear mapping of the side sideIndex
         */
        {
            TPZManVector<T,3> dCorrFactor(TGeo::Dimension,(T)0);
            TGeo::BlendFactorForSide(side, xiInterior, blendFactor[sideIndex], dCorrFactor);
            for(int iXi = 0; iXi < TGeo::Dimension; iXi++){
                dCorrFactorDxi(sideIndex,iXi) = dCorrFactor[iXi];
            }
        }

        int sidedim = gelside.Dimension();
        TPZManVector<T, 3> neighXi;
        TPZFNMatrix<9, T> dNeighXiDXi;
        if (!MapToNeighSide(side, sidedim, xiInterior, neighXi, dNeighXiDXi)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << par << " and side " << byside << " skipping the side ";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            continue;
        }
        TPZManVector<T, 3> Xside(3, 0.);
        Neighbour(side, gmesh).X(neighXi, Xside);
        TPZFNMatrix<9, T> gradNeigh;
        Neighbour(side, gmesh).GradX(neighXi,gradNeigh);
        for (int x = 0; x < 3; x++) {
            nonLinearSideMappings(sideIndex, x) = Xside[x];
        }
        gradNeigh.Multiply(dNeighXiDXi,gradNonLinSide);//gradNonLinSide = gradNeigh.dNeighXiDXi

//        else{
        TPZStack<int> containedNodesInSide;
        TGeo::LowerDimensionSides(side, containedNodesInSide, 0);

        TPZStack<int> allContainedSides;
        TGeo::LowerDimensionSides(side, allContainedSides);
        for (int subSideIndex = containedNodesInSide.NElements();
             subSideIndex < allContainedSides.NElements(); subSideIndex++) {
//            TPZFNMatrix<9, T> gradNonLinSubSide(3,TGeo::Dimension,(T)0);
            const int subSide = allContainedSides[subSideIndex];
#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside " << subSideIndex << " (global: " << subSide << ") is linear: ";
                if (IsLinearMapping(subSide)) soutLogDebug << "true" << std::endl;
                else soutLogDebug << "false" << std::endl;
            }
#endif
            if (IsLinearMapping(subSide)) continue;

            T blendFactorSide = -1;
            TPZManVector<T,3> dCorrFactorSideDxiProj(TGeo::Dimension,(T)0);
            TPZFNMatrix<3, T> dCorrFactorSideDxi(TGeo::Dimension,1,(T)0);
            TGeo::BlendFactorForSide(subSide, xiProjectedOverSide, blendFactorSide, dCorrFactorSideDxiProj);

#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside influence :" << blendFactorSide << std::endl;
            }
#endif
            TPZFNMatrix<3, T> dCorrFactorSideDxiProjMat(1,TGeo::Dimension,(T)0);
            for(int xi = 0; xi < TGeo::Dimension; xi++){
                dCorrFactorSideDxiProjMat(0,xi) = dCorrFactorSideDxiProj[xi];
            }

//                 dCorrFactorSideDxi = dXiProjectedOverSideDxi. dCorrFactorSideDxiProjMat
//                dXiProjectedOverSideDxi.Multiply(dCorrFactorSideDxiProjMat,dCorrFactorSideDxi);//mostrarphil

//                dCorrFactorSideDxi = dCorrFactorSideDxiProjMat . dXiProjectedOverSideDxi;
            dCorrFactorSideDxiProjMat.Multiply(dXiProjectedOverSideDxi,dCorrFactorSideDxi);
            #ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\n\tGrad of correction factor of point projected to side:\n";
                for(int i = 0; i < dCorrFactorSideDxi.Rows(); i++){
                    soutLogDebug<<"\t";
                    for(int j = 0; j < dCorrFactorSideDxi.Cols(); j++){
                        soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<dCorrFactorSideDxi(i,j);
                        if(j != dCorrFactorSideDxi.Cols() - 1) soutLogDebug<<"\t";
                    }
                    soutLogDebug<<std::endl;
                }
            }
            #endif
            TPZFMatrix<T> &gradNonLinSubSide = gradNonLinSideVec[subSide - TGeo::NNodes];
            TPZFMatrix<T> &gradLinSubSide = gradLinSideVec[subSide - TGeo::NNodes];
            for (int x = 0; x < 3; x++) {
                nonLinearSideMappings(sideIndex, x) -=
                        blendFactorSide *
                        (nonLinearSideMappings(subSide - TGeo::NNodes, x) -
                         linearSideMappings(subSide - TGeo::NNodes, x));
                for (int j = 0; j < TGeo::Dimension; j++) {
                    gradNonLinSide(x,j) -= blendFactorSide *  (gradNonLinSubSide(x,j)-gradLinSubSide(x,j));
                    gradNonLinSide(x,j) -= dCorrFactorSideDxi(0,j) *
                                           (nonLinearSideMappings(subSide - TGeo::NNodes, x) -
                                            linearSideMappings(subSide - TGeo::NNodes, x));
                }
            }
        }
//        }
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "Non-linear mapping: ";
            for (int x = 0; x < 3; x++) soutLogDebug << nonLinearSideMappings(sideIndex, x) << "\t";
            soutLogDebug << "\nGrad of non-linear mapping:\n";
            for(int i = 0; i < gradNonLinSide.Rows(); i++){
                for(int j = 0; j < gradNonLinSide.Cols(); j++){
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<gradNonLinSide(i,j);
                    if(j != gradNonLinSide.Cols() - 1) soutLogDebug<<"\t";
                }
                soutLogDebug<<std::endl;
            }
            soutLogDebug << std::endl;
            soutLogDebug << "adding to result mapping of side: " << side << std::endl;
            soutLogDebug << "\t\tcorrection factor: " << blendFactor[sideIndex] << std::endl;
            soutLogDebug << "\t\tdCorrFactorDxi: ";
            for(int i = 0; i < TGeo::Dimension; i++) soutLogDebug<<dCorrFactorDxi(sideIndex,i)<<"\t";
            soutLogDebug << "\n";

            soutLogDebug<<"SECOND TERM (SIDE "<<sideIndex<<") :"<<std::endl;
            soutLogDebug << "\t\tblendFactor *  (gradNonLinSide-gradLinSide): " << std::endl;
            for (int i = 0; i < 3; i++) {
                for (int j = 0; j < TGeo::Dimension; j++) {
                    const T val = blendFactor[sideIndex] *  (gradNonLinSide(i,j)-gradLinSide(i,j));
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<val;
                    if(j != TGeo::Dimension - 1) soutLogDebug<<"\t";
                }
                soutLogDebug << "\n";
            }
            soutLogDebug<<"THIRD TERM (SIDE "<<sideIndex<<") :"<<std::endl;
            soutLogDebug << "\t\tdCorrFactorDxi *\n"
                            "                              (nonLinearSideMappings -\n"
                            "                               linearSideMappings): " << std::endl;
            for (int i = 0; i < 3; i++) {
                for (int j = 0; j < TGeo::Dimension; j++) {
                    const T val = dCorrFactorDxi(sideIndex,j) *
                                  (nonLinearSideMappings(sideIndex, i) -
                                   linearSideMappings(sideIndex,i));
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<val;
                    if(j != TGeo::Dimension - 1) soutLogDebug<<"\t";
                }
                soutLogDebug << "\n";
            }

            soutLogDebug<<std::endl;
        }
#endif

        for (int i = 0; i < 3; i++) {
            for (int j = 0; j < TGeo::Dimension; j++) {
                gradx(i,j) += blendFactor[sideIndex] *  (gradNonLinSide(i,j)-gradLinSide(i,j));
                gradx(i,j) += dCorrFactorDxi(sideIndex,j) *
                              (nonLinearSideMappings(sideIndex, i) -
                               linearSideMappings(sideIndex,i));
            }
        }
    }
#ifdef PZ_LOG
    if(logger.isDebugEnabled()){
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "=============result=============" <<std::endl;
        soutLogDebug <<"================================"<<std::endl;
        for(int i = 0; i < gradx.Rows(); i++){
            for(int j = 0; j < gradx.Cols(); j++){
                soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<gradx(i,j);
                if(j != gradx.Cols() - 1) soutLogDebug<<"\t";
            }
            soutLogDebug<<std::endl;
        }
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        LOGPZ_DEBUG(logger,soutLogDebug.str())
        soutLogDebug.str("");
    }
#endif
#ifdef PZDEBUG
    for(int i = 0; i < gradx.Rows();i++){
        for(int j = 0; j < gradx.Cols(); j++) {
            if (std::isnan(TPZExtractVal::val(gradx(i,j)))) {
                DebugStop();
            }
        }
    }
#endif

}